

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool duckdb::StructType::IsUnnamed(LogicalType *type)

{
  const_reference pvVar1;
  bool bVar2;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_10;
  
  local_10.ptr = (type->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_10);
  if (local_10.ptr[1]._vptr_ExtraTypeInfo == *(_func_int ***)&local_10.ptr[1].type) {
    bVar2 = false;
  }
  else {
    pvVar1 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                           *)(local_10.ptr + 1),0);
    bVar2 = (pvVar1->first)._M_string_length == 0;
  }
  return bVar2;
}

Assistant:

LogicalType LogicalType::ForceMaxLogicalType(const LogicalType &left, const LogicalType &right) {
	LogicalType result;
	if (TryGetMaxLogicalTypeInternal<ForceGetTypeOperation>(left, right, result)) {
		return result;
	}
	// we prefer the type with the highest score
	auto left_score = GetLogicalTypeScore(left);
	auto right_score = GetLogicalTypeScore(right);
	if (left_score < right_score) {
		return right;
	} else {
		return left;
	}
}